

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessbackend.cpp
# Opt level: O1

QIODevice * __thiscall QNetworkAccessBackend::createUploadByteDevice(QNetworkAccessBackend *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  void **ppvVar5;
  code *pcVar6;
  undefined4 *puVar7;
  QIODevice *pQVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  long in_FS_OFFSET;
  QObject local_60 [8];
  long local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  code *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  lVar2 = *(long *)(lVar1 + 0xa0);
  lVar3 = *(long *)(lVar2 + 0x240);
  if (lVar3 == 0) {
    if (*(long *)(lVar2 + 0x238) == 0) {
      pQVar8 = (QIODevice *)0x0;
      goto LAB_0017873a;
    }
    QNonContiguousByteDeviceFactory::createShared((QIODevice *)&local_48);
    p_Var9 = p_Stack_40;
    pcVar6 = local_48;
    local_48 = (code *)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x90);
    *(code **)(lVar1 + 0x88) = pcVar6;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x90) = p_Var9;
    p_Var9 = p_Stack_40;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      p_Var9 = p_Stack_40;
    }
  }
  else {
    local_50 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar2 + 0x248);
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_50->_M_use_count = local_50->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_50->_M_use_count = local_50->_M_use_count + 1;
      }
    }
    local_58 = lVar3;
    QNonContiguousByteDeviceFactory::createShared(&local_48,&local_58);
    p_Var9 = p_Stack_40;
    pcVar6 = local_48;
    local_48 = (code *)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x90);
    *(code **)(lVar1 + 0x88) = pcVar6;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x90) = p_Var9;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    p_Var9 = local_50;
    if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
      p_Var9 = local_50;
    }
  }
  if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
  }
  if (*(char *)(*(long *)(this + 8) + 0xb1) == '\0') {
    ppvVar5 = *(void ***)(lVar1 + 0x88);
    local_48 = QNonContiguousByteDevice::readProgress;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    puVar7 = (undefined4 *)operator_new(0x18);
    *puVar7 = 1;
    *(code **)(puVar7 + 2) =
         QtPrivate::
         QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/access/qnetworkaccessbackend.cpp:682:17),_QtPrivate::List<long_long,_long_long>,_void>
         ::impl;
    *(QNetworkAccessBackend **)(puVar7 + 4) = this;
    QObject::connectImpl
              (local_60,ppvVar5,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_60);
  }
  pQVar8 = (QIODevice *)
           QNonContiguousByteDeviceFactory::wrap(*(QNonContiguousByteDevice **)(lVar1 + 0x88));
  *(QIODevice **)(lVar1 + 0x98) = pQVar8;
LAB_0017873a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar8;
}

Assistant:

QIODevice *QNetworkAccessBackend::createUploadByteDevice()
{
    Q_D(QNetworkAccessBackend);

    if (d->m_reply->outgoingDataBuffer)
        d->uploadByteDevice =
                QNonContiguousByteDeviceFactory::createShared(d->m_reply->outgoingDataBuffer);
    else if (d->m_reply->outgoingData) {
        d->uploadByteDevice =
                QNonContiguousByteDeviceFactory::createShared(d->m_reply->outgoingData);
    } else {
        return nullptr;
    }

    // We want signal emissions only for normal asynchronous uploads
    if (!isSynchronous()) {
        connect(d->uploadByteDevice.get(), &QNonContiguousByteDevice::readProgress, this,
                [this](qint64 a, qint64 b) {
                    Q_D(QNetworkAccessBackend);
                    if (!d->m_reply->isFinished)
                        d->m_reply->emitUploadProgress(a, b);
                });
    }

    d->wrappedUploadByteDevice = QNonContiguousByteDeviceFactory::wrap(d->uploadByteDevice.get());
    return d->wrappedUploadByteDevice;
}